

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

void __thiscall FIX::SessionState::setNextTargetMsgSeqNum(SessionState *this,SEQNUM n)

{
  Mutex::lock(&this->m_mutex);
  (*this->m_pStore->_vptr_MessageStore[7])(this->m_pStore,n);
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

EXCEPT(IOException) {
    Locker l(m_mutex);
    m_pStore->setNextTargetMsgSeqNum(n);
  }